

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiEvent * __thiscall
smf::MidiFile::addEvent
          (MidiFile *this,int aTrack,int aTick,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *midiData)

{
  MidiEvent *this_00;
  reference ppMVar1;
  MidiEvent *me;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *midiData_local;
  int aTick_local;
  int aTrack_local;
  MidiFile *this_local;
  
  this->m_timemapvalid = false;
  this_00 = (MidiEvent *)operator_new(0x38);
  MidiEvent::MidiEvent(this_00);
  this_00->tick = aTick;
  this_00->track = aTrack;
  MidiMessage::setMessage((MidiMessage *)this_00,midiData);
  ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                      (&this->m_events,(long)aTrack);
  MidiEventList::push_back_no_copy(*ppMVar1,this_00);
  return this_00;
}

Assistant:

MidiEvent* MidiFile::addEvent(int aTrack, int aTick,
		std::vector<uchar>& midiData) {
	m_timemapvalid = 0;
	MidiEvent* me = new MidiEvent;
	me->tick = aTick;
	me->track = aTrack;
	me->setMessage(midiData);
	m_events[aTrack]->push_back_no_copy(me);
	return me;
}